

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLine.cpp
# Opt level: O2

void __thiscall ProxyLine::onClosed(ProxyLine *this)

{
  String local_30;
  
  local_30.data = &local_30._data;
  local_30._data.ref = 0;
  local_30._data.str = "Closed by proxy server";
  local_30._data.len = 0x16;
  (*this->_callback->_vptr_ICallback[1])(this->_callback,this,&local_30);
  String::~String(&local_30);
  return;
}

Assistant:

void ProxyLine::onClosed()
{
    _callback.onClosed(*this, "Closed by proxy server");
}